

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  uint8_t typecode;
  _Bool _Var1;
  int iVar2;
  roaring64_bitmap_t *art;
  leaf_t *val;
  art_val_t *val_00;
  container_t *c;
  art_iterator_t *paVar3;
  art_iterator_t it1;
  art_iterator_t it2;
  
  art = roaring64_bitmap_create();
  art_init_iterator(&it1,&r1->art,true);
  art_init_iterator(&it2,&r2->art,true);
  do {
    if (it1.value == (art_val_t *)0x0) {
      return art;
    }
    if (it2.value == (art_val_t *)0x0) {
LAB_0010b93a:
      val = copy_leaf_container((leaf_t *)it1.value);
      art_insert(&art->art,it1.key,&val->_pad);
      paVar3 = &it1;
    }
    else {
      iVar2 = art_compare_keys(it1.key,it2.key);
      paVar3 = &it2;
      if (iVar2 == 0) {
        val_00 = (art_val_t *)roaring_malloc(0x10);
        c = container_andnot(*(container_t **)(it1.value[1].key + 2),it1.value[1].key[0],
                             *(container_t **)(it2.value[1].key + 2),it2.value[1].key[0],
                             val_00[1].key);
        *(container_t **)(val_00[1].key + 2) = c;
        typecode = val_00[1].key[0];
        _Var1 = container_nonzero_cardinality(c,typecode);
        if (_Var1) {
          art_insert(&art->art,it1.key,val_00);
        }
        else {
          container_free(c,typecode);
          roaring_free(val_00);
        }
        art_iterator_next(&it1);
      }
      else if (iVar2 < 0) goto LAB_0010b93a;
    }
    art_iterator_next(paVar3);
  } while( true );
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                result_leaf->container = container_andnot(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);

                if (container_nonzero_cardinality(result_leaf->container,
                                                  result_leaf->typecode)) {
                    art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                } else {
                    container_free(result_leaf->container,
                                   result_leaf->typecode);
                    free_leaf(result_leaf);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}